

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_nls.c
# Opt level: O1

int IDASetNonlinearSolver(void *ida_mem,SUNNonlinearSolver NLS)

{
  SUNNonlinearSolver_Ops p_Var1;
  int iVar2;
  int iVar3;
  int error_code;
  char *msgfmt;
  
  if (ida_mem == (void *)0x0) {
    msgfmt = "ida_mem = NULL illegal.";
    iVar3 = -0x14;
    ida_mem = (IDAMem)0x0;
    error_code = -0x14;
    iVar2 = 0x31;
  }
  else if (NLS == (SUNNonlinearSolver)0x0) {
    msgfmt = "NLS must be non-NULL";
    iVar3 = -0x16;
    ida_mem = (IDAMem)0x0;
    error_code = -0x16;
    iVar2 = 0x39;
  }
  else {
    p_Var1 = NLS->ops;
    if (((p_Var1->gettype == (_func_SUNNonlinearSolver_Type_SUNNonlinearSolver *)0x0) ||
        (p_Var1->solve ==
         (_func_int_SUNNonlinearSolver_N_Vector_N_Vector_N_Vector_sunrealtype_int_void_ptr *)0x0))
       || (p_Var1->setsysfn == (_func_SUNErrCode_SUNNonlinearSolver_SUNNonlinSolSysFn *)0x0)) {
      msgfmt = "NLS does not support required operations";
      iVar3 = -0x16;
      error_code = -0x16;
      iVar2 = 0x42;
    }
    else {
      iVar2 = SUNNonlinSolGetType(NLS);
      if (iVar2 == 0) {
        if ((*(long *)((long)ida_mem + 0x6c8) != 0) && (*(int *)((long)ida_mem + 0x6d0) != 0)) {
          SUNNonlinSolFree();
        }
        *(SUNNonlinearSolver *)((long)ida_mem + 0x6c8) = NLS;
        *(undefined4 *)((long)ida_mem + 0x6d0) = 0;
        iVar2 = SUNNonlinSolSetSysFn(NLS,idaNlsResidual);
        if (iVar2 == 0) {
          iVar2 = SUNNonlinSolSetConvTestFn
                            (*(undefined8 *)((long)ida_mem + 0x6c8),idaNlsConvTest,ida_mem);
          if (iVar2 == 0) {
            iVar2 = SUNNonlinSolSetMaxIters(*(undefined8 *)((long)ida_mem + 0x6c8),4);
            if (iVar2 == 0) {
              if (*(long *)((long)ida_mem + 0x10) != 0) {
                *(long *)((long)ida_mem + 0x730) = *(long *)((long)ida_mem + 0x10);
                return 0;
              }
              msgfmt = "The DAE residual function is NULL";
              iVar3 = -0x16;
              error_code = -0x16;
              iVar2 = 0x7a;
            }
            else {
              msgfmt = "Setting maximum number of nonlinear iterations failed";
              iVar3 = -0x16;
              error_code = -0x16;
              iVar2 = 0x72;
            }
          }
          else {
            msgfmt = "Setting convergence test function failed";
            iVar3 = -0x16;
            error_code = -0x16;
            iVar2 = 0x69;
          }
        }
        else {
          msgfmt = "Setting nonlinear system function failed";
          iVar3 = -0x16;
          error_code = -0x16;
          iVar2 = 0x60;
        }
      }
      else {
        msgfmt = "NLS type must be SUNNONLINEARSOLVER_ROOTFIND";
        iVar3 = -0x16;
        error_code = -0x16;
        iVar2 = 0x4a;
      }
    }
  }
  IDAProcessError((IDAMem)ida_mem,error_code,iVar2,"IDASetNonlinearSolver",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_nls.c"
                  ,msgfmt);
  return iVar3;
}

Assistant:

int IDASetNonlinearSolver(void* ida_mem, SUNNonlinearSolver NLS)
{
  IDAMem IDA_mem;
  int retval;

  /* return immediately if IDA memory is NULL */
  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  /* return immediately if NLS memory is NULL */
  if (NLS == NULL)
  {
    IDAProcessError(NULL, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "NLS must be non-NULL");
    return (IDA_ILL_INPUT);
  }

  /* check for required nonlinear solver functions */
  if (NLS->ops->gettype == NULL || NLS->ops->solve == NULL ||
      NLS->ops->setsysfn == NULL)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "NLS does not support required operations");
    return (IDA_ILL_INPUT);
  }

  /* check for allowed nonlinear solver types */
  if (SUNNonlinSolGetType(NLS) != SUNNONLINEARSOLVER_ROOTFIND)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "NLS type must be SUNNONLINEARSOLVER_ROOTFIND");
    return (IDA_ILL_INPUT);
  }

  /* free any existing nonlinear solver */
  if ((IDA_mem->NLS != NULL) && (IDA_mem->ownNLS))
  {
    retval = SUNNonlinSolFree(IDA_mem->NLS);
  }

  /* set SUNNonlinearSolver pointer */
  IDA_mem->NLS = NLS;

  /* Set NLS ownership flag. If this function was called to attach the default
     NLS, IDA will set the flag to SUNTRUE after this function returns. */
  IDA_mem->ownNLS = SUNFALSE;

  /* set the nonlinear residual function */
  retval = SUNNonlinSolSetSysFn(IDA_mem->NLS, idaNlsResidual);
  if (retval != IDA_SUCCESS)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Setting nonlinear system function failed");
    return (IDA_ILL_INPUT);
  }

  /* set convergence test function */
  retval = SUNNonlinSolSetConvTestFn(IDA_mem->NLS, idaNlsConvTest, ida_mem);
  if (retval != IDA_SUCCESS)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Setting convergence test function failed");
    return (IDA_ILL_INPUT);
  }

  /* set max allowed nonlinear iterations */
  retval = SUNNonlinSolSetMaxIters(IDA_mem->NLS, MAXIT);
  if (retval != IDA_SUCCESS)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Setting maximum number of nonlinear iterations failed");
    return (IDA_ILL_INPUT);
  }

  /* Set the nonlinear system RES function */
  if (!(IDA_mem->ida_res))
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "The DAE residual function is NULL");
    return (IDA_ILL_INPUT);
  }
  IDA_mem->nls_res = IDA_mem->ida_res;

  return (IDA_SUCCESS);
}